

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O0

char * xcrypt(char *str)

{
  int local_24;
  char *pcStack_20;
  int bitmask;
  char *q;
  char *p;
  char *str_local;
  
  local_24 = 1;
  pcStack_20 = xcrypt::buf;
  q = str;
  while (*q != '\0') {
    *pcStack_20 = *q;
    if ((*pcStack_20 & 0x60U) != 0) {
      *pcStack_20 = *pcStack_20 ^ (byte)local_24;
    }
    local_24 = local_24 * 2;
    if (0x1f < local_24) {
      local_24 = 1;
    }
    pcStack_20 = (char *)((byte *)pcStack_20 + 1);
    q = q + 1;
  }
  *pcStack_20 = 0;
  return xcrypt::buf;
}

Assistant:

static char *xcrypt(const char *str)
{
	static char buf[BUFSZ];
	const char *p;
	char *q;
	int bitmask;

	for (bitmask = 1, p = str, q = buf; *p; q++) {
		*q = *p++;
		if (*q & (32|64)) *q ^= bitmask;
		if ((bitmask <<= 1) >= 32) bitmask = 1;
	}
	*q = '\0';
	return buf;
}